

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O0

void Cec3_ManCreateClasses(Gia_Man_t *p,Cec3_Man_t *pMan)

{
  int iVar1;
  uint p_00;
  int iVar2;
  int iVar3;
  Gia_Rpr_t *pGVar4;
  int *__s;
  void *__s_00;
  word *pSim;
  abctime aVar5;
  abctime aVar6;
  bool bVar7;
  int iRepr;
  int Key;
  int i;
  int nTableSize;
  int *pTable;
  Gia_Obj_t *pGStack_28;
  int nWords;
  Gia_Obj_t *pObj;
  abctime clk;
  Cec3_Man_t *pMan_local;
  Gia_Man_t *p_local;
  
  iVar3 = p->nSimWords;
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    free(p->pReprs);
    p->pReprs = (Gia_Rpr_t *)0x0;
  }
  if (p->pNexts != (int *)0x0) {
    free(p->pNexts);
    p->pNexts = (int *)0x0;
  }
  iVar1 = Gia_ManObjNum(p);
  pGVar4 = (Gia_Rpr_t *)calloc((long)iVar1,4);
  p->pReprs = pGVar4;
  iVar1 = Gia_ManObjNum(p);
  __s = (int *)malloc((long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(p);
  memset(__s,0xff,(long)iVar1 << 2);
  p->pNexts = __s;
  p_00 = Gia_ManObjNum(p);
  iVar1 = Abc_PrimeCudd(p_00);
  __s_00 = malloc((long)iVar1 << 2);
  memset(__s_00,0xff,(long)iVar1 << 2);
  iRepr = 0;
  while( true ) {
    bVar7 = false;
    if (iRepr < p->nObjs) {
      pGStack_28 = Gia_ManObj(p,iRepr);
      bVar7 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    p->pReprs[iRepr] = (Gia_Rpr_t)((uint)p->pReprs[iRepr] & 0xf0000000 | 0xfffffff);
    iVar2 = Gia_ObjIsCo(pGStack_28);
    if (iVar2 == 0) {
      pSim = Cec3_ObjSim(p,iRepr);
      iVar2 = Cec3_ManSimHashKey(pSim,iVar3,iVar1);
      if ((iVar2 < 0) || (iVar1 <= iVar2)) {
        __assert_fail("Key >= 0 && Key < nTableSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                      ,0x273,"void Cec3_ManCreateClasses(Gia_Man_t *, Cec3_Man_t *)");
      }
      if (*(int *)((long)__s_00 + (long)iVar2 * 4) == -1) {
        *(int *)((long)__s_00 + (long)iVar2 * 4) = iRepr;
      }
      else {
        Gia_ObjSetRepr(p,iRepr,*(int *)((long)__s_00 + (long)iVar2 * 4));
      }
    }
    iRepr = iRepr + 1;
  }
  iRepr = Gia_ManObjNum(p);
  while (iRepr = iRepr + -1, -1 < iRepr) {
    iVar3 = Gia_ObjRepr(p,iRepr);
    if (iVar3 != 0xfffffff) {
      iVar1 = Gia_ObjNext(p,iVar3);
      Gia_ObjSetNext(p,iRepr,iVar1);
      Gia_ObjSetNext(p,iVar3,iRepr);
    }
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  aVar5 = Abc_Clock();
  for (iRepr = 0; iVar3 = Gia_ManObjNum(p), iRepr < iVar3; iRepr = iRepr + 1) {
    iVar3 = Gia_ObjIsHead(p,iRepr);
    if (iVar3 != 0) {
      Cec3_ManSimClassRefineOne(p,iRepr);
    }
  }
  aVar6 = Abc_Clock();
  pMan->timeRefine = (aVar6 - aVar5) + pMan->timeRefine;
  return;
}

Assistant:

void Cec3_ManCreateClasses( Gia_Man_t * p, Cec3_Man_t * pMan )
{
    abctime clk;
    Gia_Obj_t * pObj;
    int nWords = p->nSimWords;
    int * pTable, nTableSize, i, Key;
    // allocate representation
    ABC_FREE( p->pReprs );
    ABC_FREE( p->pNexts );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    p->pNexts = ABC_FALLOC( int, Gia_ManObjNum(p) );
    // hash each node by its simulation info
    nTableSize = Abc_PrimeCudd( Gia_ManObjNum(p) );
    pTable = ABC_FALLOC( int, nTableSize );
    Gia_ManForEachObj( p, pObj, i )
    {
        p->pReprs[i].iRepr = GIA_VOID;
        if ( Gia_ObjIsCo(pObj) )
            continue;
        Key = Cec3_ManSimHashKey( Cec3_ObjSim(p, i), nWords, nTableSize );
        assert( Key >= 0 && Key < nTableSize );
        if ( pTable[Key] == -1 )
            pTable[Key] = i;
        else
            Gia_ObjSetRepr( p, i, pTable[Key] );
    }
    // create classes
    for ( i = Gia_ManObjNum(p) - 1; i >= 0; i-- )
    {
        int iRepr = Gia_ObjRepr(p, i);
        if ( iRepr == GIA_VOID )
            continue;
        Gia_ObjSetNext( p, i, Gia_ObjNext(p, iRepr) );
        Gia_ObjSetNext( p, iRepr, i );
    }
    ABC_FREE( pTable );
    clk = Abc_Clock();
    Gia_ManForEachClass0( p, i )
        Cec3_ManSimClassRefineOne( p, i );
    pMan->timeRefine += Abc_Clock() - clk;
}